

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLExtensionHandler.cpp
# Opt level: O0

bool __thiscall
irr::video::COpenGLExtensionHandler::queryFeature
          (COpenGLExtensionHandler *this,E_VIDEO_DRIVER_FEATURE feature)

{
  byte local_35;
  byte local_34;
  byte local_33;
  byte local_32;
  byte local_31;
  byte local_30;
  byte local_2f;
  byte local_2e;
  bool local_2d;
  byte local_2c;
  byte local_2b;
  byte local_2a;
  byte local_29;
  E_VIDEO_DRIVER_FEATURE feature_local;
  COpenGLExtensionHandler *this_local;
  bool local_1;
  
  switch(feature) {
  case EVDF_RENDER_TO_TARGET:
    local_1 = true;
    break;
  case EVDF_HARDWARE_TL:
    local_1 = true;
    break;
  case EVDF_MULTITEXTURE:
    local_1 = 1 < (this->Feature).MaxTextureUnits;
    break;
  case EVDF_BILINEAR_FILTER:
    local_1 = true;
    break;
  case EVDF_MIP_MAP:
    local_1 = true;
    break;
  case EVDF_MIP_MAP_AUTO_UPDATE:
    local_29 = 0;
    if ((this->IsAtiRadeonX & 1U) == 0) {
      local_2a = 1;
      if (((this->FeatureAvailable[0x1a1] & 1U) == 0) &&
         (local_2a = 1, (this->FeatureAvailable[0xe6] & 1U) == 0)) {
        local_2a = this->FeatureAvailable[0x4f];
      }
      local_29 = local_2a;
    }
    local_1 = (bool)(local_29 & 1);
    break;
  case EVDF_STENCIL_BUFFER:
    local_1 = (bool)(this->StencilBuffer & 1);
    break;
  case EVDF_VERTEX_SHADER_1_1:
  case EVDF_ARB_VERTEX_PROGRAM_1:
    local_2b = 1;
    if ((this->FeatureAvailable[0xb3] & 1U) == 0) {
      local_2b = this->FeatureAvailable[0x189];
    }
    local_1 = (bool)(local_2b & 1);
    break;
  case EVDF_VERTEX_SHADER_2_0:
  case EVDF_PIXEL_SHADER_2_0:
  case EVDF_ARB_GLSL:
    local_2d = true;
    if ((this->FeatureAvailable[0x80] & 1U) == 0) {
      local_2d = 199 < this->Version;
    }
    local_1 = local_2d;
    break;
  default:
    local_1 = false;
    break;
  case EVDF_PIXEL_SHADER_1_1:
  case EVDF_PIXEL_SHADER_1_2:
  case EVDF_ARB_FRAGMENT_PROGRAM_1:
    local_2c = 1;
    if ((this->FeatureAvailable[0x4b] & 1U) == 0) {
      local_2c = this->FeatureAvailable[0x156];
    }
    local_1 = (bool)(local_2c & 1);
    break;
  case EVDF_TEXTURE_NSQUARE:
    local_1 = true;
    break;
  case EVDF_TEXTURE_NPOT:
    local_1 = (bool)(this->FeatureAvailable[0x9c] & 1);
    break;
  case EVDF_FRAMEBUFFER_OBJECT:
    local_2e = 1;
    if ((this->FeatureAvailable[0xe6] & 1U) == 0) {
      local_2e = this->FeatureAvailable[0x4f];
    }
    local_1 = (bool)(local_2e & 1);
    break;
  case EVDF_VERTEX_BUFFER_OBJECT:
    local_1 = (bool)(this->FeatureAvailable[0xb2] & 1);
    break;
  case EVDF_ALPHA_TO_COVERAGE:
    local_1 = (bool)(this->FeatureAvailable[0x62] & 1);
    break;
  case EVDF_COLOR_MASK:
    local_1 = true;
    break;
  case EVDF_MULTIPLE_RENDER_TARGETS:
    local_30 = 1;
    if ((this->FeatureAvailable[0x3f] & 1U) == 0) {
      local_30 = this->FeatureAvailable[0xb9];
    }
    local_1 = (bool)(local_30 & 1);
    break;
  case EVDF_MRT_BLEND:
  case EVDF_MRT_COLOR_MASK:
    local_1 = (bool)(this->FeatureAvailable[0xdf] & 1);
    break;
  case EVDF_MRT_BLEND_FUNC:
    local_31 = 1;
    if ((this->FeatureAvailable[0x40] & 1U) == 0) {
      local_31 = this->FeatureAvailable[7];
    }
    local_1 = (bool)(local_31 & 1);
    break;
  case EVDF_GEOMETRY_SHADER:
    local_2f = 1;
    if ((((this->FeatureAvailable[0x51] & 1U) == 0) &&
        (local_2f = 1, (this->FeatureAvailable[0xe8] & 1U) == 0)) &&
       (local_2f = 1, (this->FeatureAvailable[0x15b] & 1U) == 0)) {
      local_2f = this->FeatureAvailable[0x15c];
    }
    local_1 = (bool)(local_2f & 1);
    break;
  case EVDF_OCCLUSION_QUERY:
    local_32 = 0;
    if ((this->FeatureAvailable[100] & 1U) != 0) {
      local_32 = this->OcclusionQuerySupport;
    }
    local_1 = (bool)(local_32 & 1);
    break;
  case EVDF_POLYGON_OFFSET:
    local_1 = 100 < this->Version;
    break;
  case EVDF_BLEND_OPERATIONS:
    local_1 = (bool)((this->Feature).BlendOperation & 1);
    break;
  case EVDF_BLEND_SEPARATE:
    local_33 = 1;
    if (this->Version < 0x68) {
      local_33 = this->FeatureAvailable[0xcf];
    }
    local_1 = (bool)(local_33 & 1);
    break;
  case EVDF_TEXTURE_MATRIX:
    local_1 = true;
    break;
  case EVDF_TEXTURE_CUBEMAP:
    local_34 = 1;
    if ((this->Version < 0x67) && (local_34 = 1, (this->FeatureAvailable[0x91] & 1U) == 0)) {
      local_34 = this->FeatureAvailable[0x111];
    }
    local_1 = (bool)(local_34 & 1);
    break;
  case EVDF_TEXTURE_CUBEMAP_SEAMLESS:
    local_1 = (bool)(this->FeatureAvailable[0x71] & 1);
    break;
  case EVDF_DEPTH_CLAMP:
    local_35 = 1;
    if ((this->FeatureAvailable[0x14f] & 1U) == 0) {
      local_35 = this->FeatureAvailable[0x3c];
    }
    local_1 = (bool)(local_35 & 1);
  }
  return local_1;
}

Assistant:

bool COpenGLExtensionHandler::queryFeature(E_VIDEO_DRIVER_FEATURE feature) const
{
	switch (feature) {
	case EVDF_RENDER_TO_TARGET:
		return true;
	case EVDF_HARDWARE_TL:
		return true; // we cannot tell other things
	case EVDF_MULTITEXTURE:
		return Feature.MaxTextureUnits > 1;
	case EVDF_BILINEAR_FILTER:
		return true;
	case EVDF_MIP_MAP:
		return true;
	case EVDF_MIP_MAP_AUTO_UPDATE:
		return !IsAtiRadeonX && (FeatureAvailable[IRR_SGIS_generate_mipmap] || FeatureAvailable[IRR_EXT_framebuffer_object] || FeatureAvailable[IRR_ARB_framebuffer_object]);
	case EVDF_STENCIL_BUFFER:
		return StencilBuffer;
	case EVDF_VERTEX_SHADER_1_1:
	case EVDF_ARB_VERTEX_PROGRAM_1:
		return FeatureAvailable[IRR_ARB_vertex_program] || FeatureAvailable[IRR_NV_vertex_program1_1];
	case EVDF_PIXEL_SHADER_1_1:
	case EVDF_PIXEL_SHADER_1_2:
	case EVDF_ARB_FRAGMENT_PROGRAM_1:
		return FeatureAvailable[IRR_ARB_fragment_program] || FeatureAvailable[IRR_NV_fragment_program];
	case EVDF_PIXEL_SHADER_2_0:
	case EVDF_VERTEX_SHADER_2_0:
	case EVDF_ARB_GLSL:
		return (FeatureAvailable[IRR_ARB_shading_language_100] || Version >= 200);
	case EVDF_TEXTURE_NSQUARE:
		return true; // non-square is always supported
	case EVDF_TEXTURE_NPOT:
		// Some ATI cards seem to have only SW support in OpenGL 2.0
		// drivers if the extension is not exposed, so we skip this
		// extra test for now!
		// return (FeatureAvailable[IRR_ARB_texture_non_power_of_two]||Version>=200);
		return (FeatureAvailable[IRR_ARB_texture_non_power_of_two]);
	case EVDF_FRAMEBUFFER_OBJECT:
		return FeatureAvailable[IRR_EXT_framebuffer_object] || FeatureAvailable[IRR_ARB_framebuffer_object];
	case EVDF_VERTEX_BUFFER_OBJECT:
		return FeatureAvailable[IRR_ARB_vertex_buffer_object];
	case EVDF_COLOR_MASK:
		return true;
	case EVDF_ALPHA_TO_COVERAGE:
		return FeatureAvailable[IRR_ARB_multisample];
	case EVDF_GEOMETRY_SHADER:
		return FeatureAvailable[IRR_ARB_geometry_shader4] || FeatureAvailable[IRR_EXT_geometry_shader4] || FeatureAvailable[IRR_NV_geometry_program4] || FeatureAvailable[IRR_NV_geometry_shader4];
	case EVDF_MULTIPLE_RENDER_TARGETS:
		return FeatureAvailable[IRR_ARB_draw_buffers] || FeatureAvailable[IRR_ATI_draw_buffers];
	case EVDF_MRT_BLEND:
	case EVDF_MRT_COLOR_MASK:
		return FeatureAvailable[IRR_EXT_draw_buffers2];
	case EVDF_MRT_BLEND_FUNC:
		return FeatureAvailable[IRR_ARB_draw_buffers_blend] || FeatureAvailable[IRR_AMD_draw_buffers_blend];
	case EVDF_OCCLUSION_QUERY:
		return FeatureAvailable[IRR_ARB_occlusion_query] && OcclusionQuerySupport;
	case EVDF_POLYGON_OFFSET:
		// both features supported with OpenGL 1.1
		return Version >= 101;
	case EVDF_BLEND_OPERATIONS:
		return Feature.BlendOperation;
	case EVDF_BLEND_SEPARATE:
		return (Version >= 104) || FeatureAvailable[IRR_EXT_blend_func_separate];
	case EVDF_TEXTURE_MATRIX:
		return true;
	case EVDF_TEXTURE_CUBEMAP:
		return (Version >= 103) || FeatureAvailable[IRR_ARB_texture_cube_map] || FeatureAvailable[IRR_EXT_texture_cube_map];
	case EVDF_TEXTURE_CUBEMAP_SEAMLESS:
		return FeatureAvailable[IRR_ARB_seamless_cube_map];
	case EVDF_DEPTH_CLAMP:
		return FeatureAvailable[IRR_NV_depth_clamp] || FeatureAvailable[IRR_ARB_depth_clamp];

	default:
		return false;
	};
}